

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

target_ulong
helper_precrqu_s_ob_qh_mips64(target_ulong rs,target_ulong rt,CPUMIPSState_conflict5 *env)

{
  ulong local_48;
  uint64_t result;
  uint8_t local_38;
  uint8_t local_37;
  uint8_t local_36;
  uint8_t local_35;
  uint8_t temp [8];
  uint16_t rt0;
  uint16_t rt1;
  uint16_t rt2;
  uint16_t rt3;
  uint16_t rs0;
  uint16_t rs1;
  uint16_t rs2;
  uint16_t rs3;
  int i;
  CPUMIPSState_conflict5 *env_local;
  target_ulong rt_local;
  target_ulong rs_local;
  
  local_48 = 0;
  temp._6_2_ = (undefined2)(rt >> 0x30);
  temp._4_2_ = (undefined2)(rt >> 0x20);
  temp._2_2_ = (undefined2)(rt >> 0x10);
  temp._0_2_ = (undefined2)rt;
  local_35 = mipsdsp_sat8_reduce_precision((uint16_t)(rs >> 0x30),env);
  local_36 = mipsdsp_sat8_reduce_precision((uint16_t)(rs >> 0x20),env);
  local_37 = mipsdsp_sat8_reduce_precision((uint16_t)(rs >> 0x10),env);
  local_38 = mipsdsp_sat8_reduce_precision((uint16_t)rs,env);
  result._7_1_ = mipsdsp_sat8_reduce_precision(temp._6_2_,env);
  result._6_1_ = mipsdsp_sat8_reduce_precision(temp._4_2_,env);
  result._5_1_ = mipsdsp_sat8_reduce_precision(temp._2_2_,env);
  result._4_1_ = mipsdsp_sat8_reduce_precision(temp._0_2_,env);
  for (_rs0 = 0; _rs0 < 8; _rs0 = _rs0 + 1) {
    local_48 = (ulong)*(byte *)((long)&result + (long)_rs0 + 4) << ((byte)(_rs0 << 3) & 0x3f) |
               local_48;
  }
  return local_48;
}

Assistant:

target_ulong helper_precrqu_s_ob_qh(target_ulong rs, target_ulong rt,
                                    CPUMIPSState *env)
{
    int i;
    uint16_t rs3, rs2, rs1, rs0;
    uint16_t rt3, rt2, rt1, rt0;
    uint8_t temp[8];
    uint64_t result;

    result = 0;

    MIPSDSP_SPLIT64_16(rs, rs3, rs2, rs1, rs0);
    MIPSDSP_SPLIT64_16(rt, rt3, rt2, rt1, rt0);

    temp[7] = mipsdsp_sat8_reduce_precision(rs3, env);
    temp[6] = mipsdsp_sat8_reduce_precision(rs2, env);
    temp[5] = mipsdsp_sat8_reduce_precision(rs1, env);
    temp[4] = mipsdsp_sat8_reduce_precision(rs0, env);
    temp[3] = mipsdsp_sat8_reduce_precision(rt3, env);
    temp[2] = mipsdsp_sat8_reduce_precision(rt2, env);
    temp[1] = mipsdsp_sat8_reduce_precision(rt1, env);
    temp[0] = mipsdsp_sat8_reduce_precision(rt0, env);

    for (i = 0; i < 8; i++) {
        result |= (uint64_t)temp[i] << (8 * i);
    }

    return result;
}